

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ProgramSharingTest::renderResource
          (GLES2ProgramSharingTest *this,Surface *screen,Surface *reference)

{
  GLsizei GVar1;
  GLsizei GVar2;
  glReadPixelsFunc p_Var3;
  uint uVar4;
  GLenum GVar5;
  GLuint GVar6;
  GLuint GVar7;
  int iVar8;
  int iVar9;
  TestError *this_00;
  int iVar10;
  uint uVar11;
  GLsizei GVar12;
  int iVar13;
  int iVar14;
  int x;
  int iVar15;
  int iVar16;
  float fVar17;
  float s;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  float t;
  Vec4 color;
  tcu local_d8 [16];
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  PixelBufferAccess local_98;
  Vector<float,_4> local_70;
  tcu local_60 [16];
  tcu local_50 [16];
  Vector<float,_4> local_40;
  
  if (screen == (Surface *)0x0) {
    iVar16 = 0xf0;
    GVar12 = 0xf0;
  }
  else {
    GVar12 = screen->m_width;
    iVar16 = screen->m_height;
  }
  (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,GVar12,iVar16);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"viewport(0, 0, width, height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2c8);
  (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2ca);
  (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"clear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2cb);
  (*(this->super_GLES2SharingTest).m_gl.useProgram)((this->m_program->m_program).m_program);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"useProgram(m_program->getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2cd);
  GVar6 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                    ((this->m_program->m_program).m_program,"a_pos");
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x2d0);
  if (GVar6 == 0xffffffff) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"coordLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x2d1);
  }
  else {
    GVar7 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                      ((this->m_program->m_program).m_program,"a_color");
    GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
    glu::checkError(GVar5,"glGetAttribLocation()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                    ,0x2d4);
    if (GVar7 != 0xffffffff) {
      (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar7);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"enableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2d7);
      (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar6);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"enableVertexAttribArray(coordLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2d8);
      (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar7,4,0x1406,'\0',0,renderResource::colors);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2da);
      (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
                (GVar6,2,0x1406,'\0',0,renderResource::coords);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2db);
      (*(this->super_GLES2SharingTest).m_gl.drawElements)(4,6,0x1403,renderResource::indices);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2dd);
      (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar6);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"disableVertexAttribArray(coordLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2de);
      (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar7);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"disableVertexAttribArray(colorLocation)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2df);
      (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
      GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
      glu::checkError(GVar5,"useProgram(0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                      ,0x2e0);
      if (screen != (Surface *)0x0) {
        p_Var3 = (this->super_GLES2SharingTest).m_gl.readPixels;
        GVar1 = screen->m_width;
        GVar2 = screen->m_height;
        tcu::Surface::getAccess(&local_98,screen);
        (*p_Var3)(0,0,GVar1,GVar2,0x1908,0x1401,local_98.super_ConstPixelBufferAccess.m_data);
        tcu::Surface::getAccess(&local_98,reference);
        local_b8.m_data[0] = 3.57331e-43;
        local_b8.m_data[1] = 0.0;
        local_b8.m_data[2] = 0.0;
        local_b8.m_data[3] = 3.57331e-43;
        tcu::clear(&local_98,(IVec4 *)&local_b8);
        fVar17 = (float)GVar12 * 0.5;
        iVar15 = (int)(fVar17 * -0.9 + fVar17);
        iVar8 = (int)(fVar17 * 0.9 + fVar17);
        fVar17 = (float)iVar16 * 0.5;
        iVar10 = (int)(fVar17 * -0.9 + fVar17);
        iVar9 = (int)(fVar17 * 0.9 + fVar17);
        for (iVar16 = iVar15; iVar16 <= iVar8; iVar16 = iVar16 + 1) {
          fVar17 = (float)(iVar16 - iVar15) / (float)(iVar8 - iVar15);
          for (iVar14 = 0; iVar13 = iVar10 + iVar14, iVar13 <= iVar9; iVar14 = iVar14 + 1) {
            s = (float)iVar14 / (float)(iVar9 - iVar10);
            local_98.super_ConstPixelBufferAccess.m_format.order = R;
            local_98.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
            local_98.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
            local_98.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
            local_b8.m_data[0] = 1.0;
            local_b8.m_data[1] = 0.0;
            local_b8.m_data[2] = 0.0;
            local_b8.m_data[3] = 1.0;
            local_c8.m_data[0] = 0.0;
            local_c8.m_data[1] = 1.0;
            local_c8.m_data[2] = 0.0;
            local_c8.m_data[3] = 1.0;
            local_a8.m_data[0] = 0.0;
            local_a8.m_data[1] = 0.0;
            local_a8.m_data[2] = 1.0;
            local_a8.m_data[3] = 1.0;
            tcu::Vector<float,_4>::Vector(&color);
            if (fVar17 <= s) {
              tcu::operator*(local_50,1.0 - s,(Vector<float,_4> *)&local_98);
              tcu::operator*(local_60,s - fVar17,&local_a8);
              tcu::operator+((tcu *)&local_40,(Vector<float,_4> *)local_50,
                             (Vector<float,_4> *)local_60);
              s = fVar17;
            }
            else {
              tcu::operator*(local_50,1.0 - fVar17,(Vector<float,_4> *)&local_98);
              tcu::operator*(local_60,fVar17 - s,&local_b8);
              tcu::operator+((tcu *)&local_40,(Vector<float,_4> *)local_50,
                             (Vector<float,_4> *)local_60);
            }
            tcu::operator*((tcu *)&local_70,s,&local_c8);
            tcu::operator+(local_d8,&local_40,&local_70);
            color.m_data[0] = (float)local_d8._0_8_;
            color.m_data[1] = SUB84(local_d8._0_8_,4);
            color.m_data[2] = (float)local_d8._8_8_;
            color.m_data[3] = SUB84(local_d8._8_8_,4);
            uVar18 = (uint)(color.m_data[0] * 255.0);
            uVar19 = (uint)(color.m_data[1] * 255.0);
            uVar20 = (uint)(color.m_data[2] * 255.0);
            uVar21 = (uint)(color.m_data[3] * 255.0);
            uVar4 = uVar18;
            if (0xfe < uVar18) {
              uVar4 = 0xff;
            }
            uVar11 = uVar19;
            if (0xfe < uVar19) {
              uVar11 = 0xff;
            }
            uVar22 = -(uint)(-0x7fffff02 < (int)(uVar20 ^ 0x80000000));
            uVar23 = -(uint)(-0x7fffff02 < (int)(uVar21 ^ 0x80000000));
            *(uint *)((long)(reference->m_pixels).m_ptr +
                     (long)(iVar13 * reference->m_width + iVar16) * 4) =
                 ~((int)uVar21 >> 0x1f) & (uVar23 >> 0x18 | ~uVar23 & uVar21) << 0x18 |
                 ~((int)uVar19 >> 0x1f) & uVar11 << 8 |
                 ~((int)uVar20 >> 0x1f) & (uVar22 >> 0x18 | ~uVar22 & uVar20) << 0x10 |
                 ~((int)uVar18 >> 0x1f) & uVar4;
          }
        }
      }
      return;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"colorLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x2d5);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLES2ProgramSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-0.9f, -0.9f,
		 0.9f, -0.9f,
		 0.9f,  0.9f,
		-0.9f,  0.9f
	};

	static const GLfloat colors [] = {
		0.0f, 0.0f, 0.0f, 1.0f,
		1.0f, 0.0f, 0.0f, 1.0f,
		0.0f, 1.0f, 0.0f, 1.0f,
		0.0f, 0.0f, 1.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(m_program->getProgram()));

	GLuint coordLocation = m_gl.getAttribLocation(m_program->getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint colorLocation = m_gl.getAttribLocation(m_program->getProgram(), "a_color");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(colorLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(colorLocation, 4, GL_FLOAT, GL_FALSE, 0, colors));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(colorLocation));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		tcu::clear(reference->getAccess(), tcu::IVec4(0xff, 0, 0, 0xff));

		int x1 = (int)(((float)width/2.0f)  * (-0.9f) + ((float)width/2.0f));
		int x2 = (int)(((float)width/2.0f)  *   0.9f  + ((float)width/2.0f));
		int y1 = (int)(((float)height/2.0f) * (-0.9f) + ((float)height/2.0f));
		int y2 = (int)(((float)height/2.0f) *   0.9f  + ((float)height/2.0f));

		for (int x = x1; x <= x2; x++)
		{
			for (int y = y1; y <= y2; y++)
			{
				float t = ((float)(x-x1) / (float)(x2-x1));
				float s = ((float)(y-y1) / (float)(y2-y1));
				bool isUpper = t > s;

				tcu::Vec4 a(colors[0],		colors[1],		colors[2],		colors[3]);
				tcu::Vec4 b(colors[4 + 0],	colors[4 + 1],	colors[4 + 2],	colors[4 + 3]);
				tcu::Vec4 c(colors[8 + 0],	colors[8 + 1],	colors[8 + 2],	colors[8 + 3]);
				tcu::Vec4 d(colors[12 + 0],	colors[12 + 1],	colors[12 + 2],	colors[12 + 3]);


				tcu::Vec4 color;

				if (isUpper)
					color = a * (1.0f - t)  + b * (t - s) + s * c;
				else
					color = a * (1.0f - s)  + d * (s - t) + t * c;

				int red		= deClamp32((int)(255.0f * color.x()), 0, 255);
				int green	= deClamp32((int)(255.0f * color.y()), 0, 255);
				int blue	= deClamp32((int)(255.0f * color.z()), 0, 255);
				int alpha	= deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(red, green, blue, alpha));
			}
		}
	}
}